

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::Shortcut(ImGuiKeyChord key_chord,ImGuiInputFlags flags,ImGuiID owner_id)

{
  bool bVar1;
  ImGuiID in_EDX;
  uint in_ESI;
  ImGuiID in_EDI;
  ImGuiContext *g;
  ImGuiContext *pIVar2;
  ImGuiInputFlags flags_00;
  ImGuiInputFlags in_stack_fffffffffffffffc;
  
  if ((in_ESI & 0x3c00) == 0) {
    in_ESI = in_ESI | 0x800;
  }
  pIVar2 = GImGui;
  if ((in_EDX == 0) || (in_EDX == 0xffffffff)) {
    in_EDX = GetRoutingIdFromOwnerId(in_EDX);
  }
  if ((pIVar2->CurrentItemFlags & 0x400U) == 0) {
    bVar1 = SetShortcutRouting(key_chord,flags,owner_id);
    flags_00 = (ImGuiInputFlags)((ulong)pIVar2 >> 0x20);
    if (bVar1) {
      if (((in_ESI & 1) != 0) && ((in_ESI & 0xf0) == 0)) {
        in_ESI = in_ESI | 0x20;
      }
      bVar1 = IsKeyChordPressed((ImGuiKeyChord)g,in_stack_fffffffffffffffc,in_EDI);
      if (bVar1) {
        SetKeyOwnersForKeyChord(in_ESI,in_EDX,flags_00);
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ImGui::Shortcut(ImGuiKeyChord key_chord, ImGuiInputFlags flags, ImGuiID owner_id)
{
    ImGuiContext& g = *GImGui;
    //IMGUI_DEBUG_LOG("Shortcut(%s, flags=%X, owner_id=0x%08X)\n", GetKeyChordName(key_chord, g.TempBuffer.Data, g.TempBuffer.Size), flags, owner_id);

    // When using (owner_id == 0/Any): SetShortcutRouting() will use CurrentFocusScopeId and filter with this, so IsKeyPressed() is fine with he 0/Any.
    if ((flags & ImGuiInputFlags_RouteTypeMask_) == 0)
        flags |= ImGuiInputFlags_RouteFocused;

    // Using 'owner_id == ImGuiKeyOwner_Any/0': auto-assign an owner based on current focus scope (each window has its focus scope by default)
    // Effectively makes Shortcut() always input-owner aware.
    if (owner_id == ImGuiKeyOwner_Any || owner_id == ImGuiKeyOwner_NoOwner)
        owner_id = GetRoutingIdFromOwnerId(owner_id);

    if (g.CurrentItemFlags & ImGuiItemFlags_Disabled)
        return false;

    // Submit route
    if (!SetShortcutRouting(key_chord, flags, owner_id))
        return false;

    // Default repeat behavior for Shortcut()
    // So e.g. pressing Ctrl+W and releasing Ctrl while holding W will not trigger the W shortcut.
    if ((flags & ImGuiInputFlags_Repeat) != 0 && (flags & ImGuiInputFlags_RepeatUntilMask_) == 0)
        flags |= ImGuiInputFlags_RepeatUntilKeyModsChange;

    if (!IsKeyChordPressed(key_chord, flags, owner_id))
        return false;

    // Claim mods during the press
    SetKeyOwnersForKeyChord(key_chord & ImGuiMod_Mask_, owner_id);

    IM_ASSERT((flags & ~ImGuiInputFlags_SupportedByShortcut) == 0); // Passing flags not supported by this function!
    return true;
}